

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t icu_63::CollationRuleParser::getReorderCode(char *word)

{
  int iVar1;
  int local_1c;
  int32_t script;
  int32_t i;
  char *word_local;
  
  local_1c = 0;
  while( true ) {
    if (4 < local_1c) {
      word_local._4_4_ = u_getPropertyValueEnum_63(UCHAR_SCRIPT,word);
      if (word_local._4_4_ < 0) {
        iVar1 = uprv_stricmp_63(word,"others");
        if (iVar1 == 0) {
          word_local._4_4_ = 0x67;
        }
        else {
          word_local._4_4_ = -1;
        }
      }
      return word_local._4_4_;
    }
    iVar1 = uprv_stricmp_63(word,*(char **)(gSpecialReorderCodes + (long)local_1c * 8));
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return local_1c + 0x1000;
}

Assistant:

int32_t
CollationRuleParser::getReorderCode(const char *word) {
    for(int32_t i = 0; i < UPRV_LENGTHOF(gSpecialReorderCodes); ++i) {
        if(uprv_stricmp(word, gSpecialReorderCodes[i]) == 0) {
            return UCOL_REORDER_CODE_FIRST + i;
        }
    }
    int32_t script = u_getPropertyValueEnum(UCHAR_SCRIPT, word);
    if(script >= 0) {
        return script;
    }
    if(uprv_stricmp(word, "others") == 0) {
        return UCOL_REORDER_CODE_OTHERS;  // same as Zzzz = USCRIPT_UNKNOWN
    }
    return -1;
}